

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

uint32_t Average3_SSE2(uint32_t a0,uint32_t a1,uint32_t a2)

{
  uint32_t in_EDX;
  undefined4 in_ESI;
  uint32_t in_EDI;
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 extraout_XMM0_Qa;
  ushort uVar4;
  __m128i A2;
  __m128i avg2;
  __m128i sum;
  __m128i A1;
  __m128i avg1;
  __m128i zero;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 local_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  
  Average2_uint32_16_SSE2(in_EDI,in_EDX);
  local_b8 = (byte)in_ESI;
  uStack_b7 = (byte)((uint)in_ESI >> 8);
  uStack_b6 = (byte)((uint)in_ESI >> 0x10);
  uStack_b5 = (byte)((uint)in_ESI >> 0x18);
  local_78 = (short)extraout_XMM0_Qa;
  uStack_76 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
  uStack_74 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
  uStack_72 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
  uStack_86 = (ushort)uStack_b7;
  uStack_84 = (ushort)uStack_b6;
  uStack_82 = (ushort)uStack_b5;
  uVar1 = (ushort)(local_78 + (ushort)local_b8) >> 1;
  uVar2 = (ushort)(uStack_76 + uStack_86) >> 1;
  uVar3 = (ushort)(uStack_74 + uStack_84) >> 1;
  uVar4 = (ushort)(uStack_72 + uStack_82) >> 1;
  return CONCAT13((uVar4 != 0) * (uVar4 < 0x100) * (char)uVar4 - (0xff < uVar4),
                  CONCAT12((uVar3 != 0) * (uVar3 < 0x100) * (char)uVar3 - (0xff < uVar3),
                           CONCAT11((uVar2 != 0) * (uVar2 < 0x100) * (char)uVar2 - (0xff < uVar2),
                                    (uVar1 != 0) * (uVar1 < 0x100) * (char)uVar1 - (0xff < uVar1))))
  ;
}

Assistant:

static WEBP_INLINE uint32_t Average3_SSE2(uint32_t a0, uint32_t a1,
                                          uint32_t a2) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i avg1 = Average2_uint32_16_SSE2(a0, a2);
  const __m128i A1 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)a1), zero);
  const __m128i sum = _mm_add_epi16(avg1, A1);
  const __m128i avg2 = _mm_srli_epi16(sum, 1);
  const __m128i A2 = _mm_packus_epi16(avg2, avg2);
  return (uint32_t)_mm_cvtsi128_si32(A2);
}